

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O0

int __thiscall
highs::CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree>::link
          (CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree> *this,char *__from,char *__to)

{
  int iVar1;
  SuboptimalNodeRbTree *pSVar2;
  int64_t in_stack_ffffffffffffffa8;
  bool local_41;
  pair<double,_long> local_38;
  pair<double,_long> local_28;
  char *local_18;
  char *local_10;
  CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree> *local_8;
  
  local_18 = __to;
  local_10 = __from;
  local_8 = this;
  if ((char *)*this->first_ == __to) {
    pSVar2 = (SuboptimalNodeRbTree *)RbTreeLinks<long>::noLink<long,_0>();
    local_41 = true;
    if ((SuboptimalNodeRbTree *)__to != pSVar2) {
      local_28 = HighsNodeQueue::SuboptimalNodeRbTree::getKey
                           ((SuboptimalNodeRbTree *)__to,in_stack_ffffffffffffffa8);
      local_38 = HighsNodeQueue::SuboptimalNodeRbTree::getKey
                           ((SuboptimalNodeRbTree *)__to,in_stack_ffffffffffffffa8);
      local_41 = std::operator<(&local_28,&local_38);
    }
    if (local_41 != false) {
      *this->first_ = (LinkType)local_10;
    }
  }
  iVar1 = RbTree<HighsNodeQueue::SuboptimalNodeRbTree>::link
                    (&this->super_RbTree<HighsNodeQueue::SuboptimalNodeRbTree>,local_10,local_18);
  return iVar1;
}

Assistant:

void link(LinkType z, LinkType parent) {
    if (first_ == parent) {
      if (parent == RbTreeLinks<LinkType>::noLink() ||
          static_cast<const Impl*>(this)->getKey(z) <
              static_cast<const Impl*>(this)->getKey(parent))
        first_ = z;
    }

    RbTree<Impl>::link(z, parent);
  }